

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Msk.cpp
# Opt level: O0

int processMsk4(istream *in,path *output)

{
  bool bVar1;
  int iVar2;
  uchar *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  runtime_error *prVar4;
  size_type sVar5;
  char *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> decompressedData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> compressedData;
  Size size;
  Msk4Header header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  undefined1 isSwitch;
  int in_stack_fffffffffffffe0c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_fffffffffffffe3c;
  int __val;
  allocator<char> local_199;
  string local_198 [32];
  undefined8 local_178;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  uint8_t *in_stack_fffffffffffffe98;
  PNGColorType in_stack_fffffffffffffea4;
  path *in_stack_fffffffffffffea8;
  Size in_stack_fffffffffffffeb0;
  string local_88 [48];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  undefined1 local_40 [32];
  uint uStack_20;
  ushort local_1c;
  ushort local_1a;
  int local_18;
  char *local_8;
  
  local_8 = in_RDI;
  operator>>((istream *)in_stack_fffffffffffffe20,
             (Msk4Header *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  local_40._28_4_ = ZEXT24(local_1c);
  uStack_20 = (uint)local_1a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13364c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x133659);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_fffffffffffffe10,CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
            );
  isSwitch = (undefined1)((uint)in_stack_fffffffffffffe08 >> 0x18);
  std::istream::seekg((long)local_8,local_18 + 4);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1336ad);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  std::istream::read(local_8,(long)puVar3);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1336e2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__lhs);
  bVar1 = decompressHigu((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         (uint8_t *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                         (bool)isSwitch);
  __val = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe3c);
  if (!bVar1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Decompression failed");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_58);
  iVar2 = Size::area((Size *)(local_40 + 0x1c));
  if (sVar5 != (long)iVar2) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    Size::area((Size *)(local_40 + 0x1c));
    std::__cxx11::to_string(__val);
    std::operator+((char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::operator+(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_58);
    std::__cxx11::to_string((unsigned_long)__lhs);
    std::operator+(__lhs,in_stack_fffffffffffffe20);
    std::operator+(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
    std::filesystem::__cxx11::path::string((path *)CONCAT44(iVar2,in_stack_fffffffffffffe18));
    std::operator+(__lhs,in_stack_fffffffffffffe20);
    std::runtime_error::runtime_error(prVar4,local_88);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_178 = CONCAT44(uStack_20,local_40._28_4_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x133a92);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)__lhs,(allocator<char> *)in_stack_fffffffffffffe20);
  writePNG(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,in_stack_fffffffffffffeb0,
           in_stack_fffffffffffffe98,
           (string *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffe00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffe00);
  return 0;
}

Assistant:

int processMsk4(std::istream &in, const fs::path &output) {
	Msk4Header header;
	in >> header;
	Size size { header.width, header.height };

	std::vector<uint8_t> compressedData, decompressedData;
	// First thing in data is its size (uint32)
	compressedData.resize(header.dataSize - 4);
	in.seekg(header.dataOffset + 4, in.beg);
	in.read((char *)compressedData.data(), compressedData.size());

	// TODO: Figure out what the stuff between the header and data is

	if (!decompressHigu(decompressedData, compressedData.data(), (int)compressedData.size(), true)) {
		throw std::runtime_error("Decompression failed");
	}

	if (decompressedData.size() != size.area()) {
		throw std::runtime_error("Expected " + std::to_string(size.area()) + " bytes but got " + std::to_string(decompressedData.size()) + " bytes when processing " + currentFileName.string());
	}

	writePNG(output, PNGColorType::GRAY, size, decompressedData.data());

	return 0;
}